

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shared-validator.cc
# Opt level: O2

Result __thiscall
wabt::SharedValidator::CheckLocalIndex(SharedValidator *this,Var *param_1,Type *out_type)

{
  pointer pLVar1;
  Result RVar2;
  char *pcVar3;
  ulong uVar4;
  ulong uVar5;
  pointer pLVar6;
  
  pLVar1 = (this->locals_).
           super__Vector_base<wabt::SharedValidator::LocalDecl,_std::allocator<wabt::SharedValidator::LocalDecl>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pLVar6 = (this->locals_).
           super__Vector_base<wabt::SharedValidator::LocalDecl,_std::allocator<wabt::SharedValidator::LocalDecl>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  pcVar3 = Var::index(param_1,(char *)param_1,(int)out_type);
  uVar5 = (long)pLVar6 - (long)pLVar1 >> 3;
  while (pLVar6 = pLVar1, 0 < (long)uVar5) {
    uVar4 = uVar5 >> 1;
    uVar5 = ~uVar4 + uVar5;
    pLVar1 = pLVar6 + uVar4 + 1;
    if ((uint)pcVar3 < pLVar6[uVar4].end) {
      pLVar1 = pLVar6;
      uVar5 = uVar4;
    }
  }
  pLVar1 = (this->locals_).
           super__Vector_base<wabt::SharedValidator::LocalDecl,_std::allocator<wabt::SharedValidator::LocalDecl>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (pLVar6 != pLVar1) {
    out_type->enum_ = (pLVar6->type).enum_;
    return (Result)Ok;
  }
  if ((this->locals_).
      super__Vector_base<wabt::SharedValidator::LocalDecl,_std::allocator<wabt::SharedValidator::LocalDecl>_>
      ._M_impl.super__Vector_impl_data._M_start == pLVar6) {
    uVar5 = 0;
  }
  else {
    uVar5 = (ulong)pLVar1[-1].end;
  }
  RVar2 = PrintError(this,&param_1->loc,"local variable out of range (max %u)",uVar5);
  return (Result)RVar2.enum_;
}

Assistant:

Result SharedValidator::CheckLocalIndex(Var local_var, Type* out_type) {
  auto iter = std::upper_bound(
      locals_.begin(), locals_.end(), local_var.index(),
      [](Index index, const LocalDecl& decl) { return index < decl.end; });
  if (iter == locals_.end()) {
    // TODO: better error
    return PrintError(local_var.loc, "local variable out of range (max %u)",
                      GetLocalCount());
  }
  *out_type = iter->type;
  return Result::Ok;
}